

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * __thiscall tinyxml2::XMLElement::Attribute(XMLElement *this,char *name,char *value)

{
  int iVar1;
  XMLAttribute *pXVar2;
  char *pcVar3;
  
  pXVar2 = FindAttribute(this,name);
  if (pXVar2 == (XMLAttribute *)0x0) {
    return (char *)0x0;
  }
  if (((value != (char *)0x0) && (pcVar3 = StrPair::GetStr(&pXVar2->_value), pcVar3 != value)) &&
     (iVar1 = strncmp(pcVar3,value,0x7fffffff), iVar1 != 0)) {
    return (char *)0x0;
  }
  pcVar3 = StrPair::GetStr(&pXVar2->_value);
  return pcVar3;
}

Assistant:

const char* XMLElement::Attribute(const char* name, const char* value) const
{
    const XMLAttribute* a = FindAttribute(name);
    if (!a) {
        return 0;
    }
    if (!value || XMLUtil::StringEqual(a->Value(), value)) {
        return a->Value();
    }
    return 0;
}